

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcProductDefinitionShape::~IfcProductDefinitionShape
          (IfcProductDefinitionShape *this,void **vtt)

{
  void **vtt_local;
  IfcProductDefinitionShape *this_local;
  
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductDefinitionShape,_0UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcProductDefinitionShape,_0UL> *)
             &(this->super_IfcProductRepresentation).field_0x78,vtt + 5);
  IfcProductRepresentation::~IfcProductRepresentation(&this->super_IfcProductRepresentation,vtt + 1)
  ;
  return;
}

Assistant:

IfcProductDefinitionShape() : Object("IfcProductDefinitionShape") {}